

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_psbt.cpp
# Opt level: O0

void cfd::api::json::PsbtJsonApi::DecodePsbt
               (DecodePsbtRequest *request,DecodePsbtResponse *response)

{
  JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pJVar1;
  DecodePsbtInput *this;
  bool bVar2;
  uint8_t uVar3;
  NetType NVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  undefined8 uVar7;
  ulong uVar8;
  DecodePsbtUtxo *pDVar9;
  reference this_00;
  reference pvVar10;
  reference key_00;
  PsbtBip32Data *this_01;
  DecodePsbtInput *in_RSI;
  DecodePsbtRequest *in_RDI;
  Amount AVar11;
  ByteData data_2;
  ByteData *key_2;
  iterator __end3_2;
  iterator __begin3_2;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__range3_2;
  PsbtBip32Data bip32_data_1;
  KeyData key_data_1;
  iterator __end4_3;
  iterator __begin4_3;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *__range4_3;
  JsonObjectVector<cfd::api::json::PsbtBip32Data,_PsbtBip32DataStruct> *bip32_list_1;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> bip32_pubkey_list_1;
  Script sh_script;
  Script script_1;
  bool is_witness_1;
  TxOutReference *txout_1;
  DecodePsbtOutput output;
  uint32_t index_1;
  Amount total_output;
  ByteData data_1;
  ByteData *key_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__range3_1;
  ByteData *stack;
  iterator __end4_2;
  iterator __begin4_2;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__range4_2;
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *witness;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> witness_stack;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> scriptsig_arr;
  PsbtBip32Data bip32_data;
  KeyData key_data;
  iterator __end4_1;
  iterator __begin4_1;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *__range4_1;
  JsonObjectVector<cfd::api::json::PsbtBip32Data,_PsbtBip32DataStruct> *bip32_list;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> bip32_pubkey_list;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> addr_list_2;
  string script_type_2;
  Script witness_script;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> addr_list_1;
  string script_type_1;
  Script redeem_script;
  SigHashType sighashtype;
  PsbtSignatureData sig_data;
  ByteData sig;
  Pubkey pubkey;
  iterator __end4;
  iterator __begin4;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *__range4;
  JsonObjectVector<cfd::api::json::PsbtSignatureData,_PsbtSignatureDataStruct> *sig_list;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> sig_pubkey_list;
  TxOutReference txout;
  string utxo_tx_hex;
  Transaction full_utxo;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> addr_list;
  string script_type;
  DecodePsbtLockingScript *script;
  TxOut utxo;
  bool is_witness;
  bool has_amount;
  TxInReference tx_input;
  DecodePsbtInput input;
  uint32_t index;
  uint32_t max;
  bool is_unset_utxo;
  Amount total_input;
  ByteData data;
  ByteData *key;
  iterator __end2;
  iterator __begin2;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__range2;
  JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct> *unknown_list;
  XpubData *xpub_data;
  PsbtGlobalXpub xpub_obj;
  ExtPubkey *extkey;
  KeyData *xpub;
  iterator __end3;
  iterator __begin3;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *__range3;
  JsonObjectVector<cfd::api::json::PsbtGlobalXpub,_PsbtGlobalXpubStruct> *xpubs;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> xpub_list;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> key_list;
  string tx_hex;
  PsbtMapData item;
  DecodeRawTransactionResponse tx_res;
  DecodeRawTransactionRequest tx_req;
  Transaction tx;
  Psbt psbt;
  AddressFactory addr_factory;
  NetType net_type;
  string *hex_string;
  DecodeRawTransactionResponse *in_stack_ffffffffffffd8f8;
  DecodePsbtInput *in_stack_ffffffffffffd900;
  undefined7 in_stack_ffffffffffffd908;
  undefined1 in_stack_ffffffffffffd90f;
  DecodePsbtInput *in_stack_ffffffffffffd910;
  undefined8 in_stack_ffffffffffffd918;
  CfdError error_code;
  CfdException *in_stack_ffffffffffffd920;
  allocator *paVar12;
  DecodePsbtOutput *in_stack_ffffffffffffd930;
  KeyData *in_stack_ffffffffffffd938;
  KeyData *in_stack_ffffffffffffd940;
  PsbtGlobalXpub *in_stack_ffffffffffffd950;
  PsbtBip32Data *in_stack_ffffffffffffd960;
  DecodePsbtInput *in_stack_ffffffffffffd980;
  byte local_2426;
  Amount local_2318;
  int64_t local_2308;
  allocator local_22f9;
  string local_22f8 [39];
  undefined1 local_22d1 [33];
  string local_22b0;
  string local_2290;
  ByteData local_2270;
  ByteData *local_2258;
  __normal_iterator<cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
  local_2250;
  __normal_iterator<cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
  local_2248;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *local_2240;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_2238;
  allocator local_2219;
  string local_2218 [32];
  string local_21f8;
  string local_21d8;
  ByteData local_21b8;
  string local_21a0;
  Pubkey local_2180;
  string local_2168 [6];
  KeyData local_2090;
  __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
  local_1f40;
  __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
  local_1f38;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *local_1f30;
  PsbtBip32Data *local_1f28;
  allocator local_1f19;
  string local_1f18 [32];
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_1ef8;
  string local_1ee0;
  string local_1ec0;
  allocator local_1e99;
  string local_1e98 [39];
  allocator local_1e71;
  string local_1e70 [32];
  string local_1e50;
  string local_1e30;
  Script local_1e10;
  Script local_1dd8;
  string local_1da0;
  string local_1d80;
  allocator local_1d59;
  string local_1d58 [39];
  allocator local_1d31;
  string local_1d30 [32];
  Script local_1d10;
  bool local_1cd1;
  int64_t local_1cd0;
  undefined1 local_1cc8;
  int64_t local_1cc0;
  undefined1 local_1cb8;
  Amount local_1cb0;
  AbstractTxOutReference local_1ca0;
  AbstractTxOutReference *local_1c50;
  pointer in_stack_ffffffffffffe530;
  pointer in_stack_ffffffffffffe538;
  Script *in_stack_ffffffffffffe540;
  pointer in_stack_ffffffffffffe548;
  uint32_t local_1a9c;
  Amount local_1a98;
  allocator local_1a81;
  string local_1a80 [32];
  string local_1a60;
  string local_1a40;
  DecodeRawTransactionResponse *in_stack_ffffffffffffe5e8;
  DecodeRawTransactionRequest *in_stack_ffffffffffffe5f0;
  __normal_iterator<cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
  local_1a00;
  __normal_iterator<cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
  local_19f8;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *local_19f0;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_19e8;
  string local_19d0;
  reference local_19b0;
  __normal_iterator<cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
  local_19a8;
  __normal_iterator<cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
  local_19a0;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *local_1998;
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1990;
  allocator local_1981;
  string local_1980 [32];
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_1960;
  allocator local_1941;
  string local_1940 [32];
  Script local_1920;
  string local_18e8;
  string local_18c8;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_18a8;
  allocator local_1889;
  string local_1888 [32];
  string local_1868;
  string local_1848;
  ByteData local_1828;
  string local_1810;
  Pubkey local_17f0;
  string local_17d8 [6];
  KeyData local_1700;
  __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
  local_15b0;
  __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
  local_15a8;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *local_15a0;
  JsonObjectVector<cfd::api::json::PsbtBip32Data,_PsbtBip32DataStruct> *local_1598;
  allocator local_1589;
  string local_1588 [32];
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_1568;
  string local_1550;
  string local_1530;
  string local_14f8 [39];
  allocator local_14d1;
  string local_14d0 [32];
  Script local_14b0;
  string local_1478;
  string local_1458;
  string local_1420 [39];
  allocator local_13f9;
  string local_13f8 [32];
  Script local_13d8;
  SigHashType local_13a0 [2];
  undefined1 local_1380 [16];
  string local_1370 [32];
  string local_1350;
  string local_1330 [4];
  ByteData local_1298;
  Pubkey local_1280;
  __normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
  local_1268;
  __normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
  local_1260;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *local_1258;
  JsonObjectVector<cfd::api::json::PsbtSignatureData,_PsbtSignatureDataStruct> *local_1250;
  allocator local_1241;
  string local_1240 [32];
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_1220;
  allocator local_1201;
  string local_1200 [32];
  int64_t local_11e0;
  undefined1 local_11d8;
  int64_t local_11d0;
  undefined1 local_11c8;
  Amount local_11c0;
  AbstractTxOutReference local_11b0;
  allocator local_1159;
  string local_1158 [39];
  allocator local_1131;
  string local_1130 [39];
  allocator local_1109;
  string local_1108 [32];
  string local_10e8 [32];
  string local_10c8;
  allocator local_10a1;
  string local_10a0 [39];
  allocator local_1079;
  string local_1078 [32];
  Txid local_1058;
  Txid local_1038;
  Transaction local_1018;
  Script local_fd8;
  string local_fa0;
  Script local_f80;
  string local_f48;
  string local_f28;
  Script local_f08;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> local_ed0;
  string local_eb8 [32];
  DecodePsbtLockingScript *local_e98;
  int64_t local_e90;
  undefined1 local_e88;
  Amount local_e80;
  int64_t local_e70;
  int64_t local_e68;
  undefined1 local_e60;
  int64_t local_e58;
  undefined1 local_e50;
  Amount local_e48;
  allocator local_e31;
  string local_e30 [32];
  Script local_e10;
  AbstractTxOut local_dd8;
  bool local_d82;
  byte local_d81;
  AbstractTxInReference local_d80;
  DecodePsbtInput local_cf0;
  uint local_884;
  uint local_880;
  byte local_879;
  Amount local_878;
  allocator local_861;
  string local_860 [32];
  string local_840;
  string local_820;
  ByteData local_800;
  ByteData *local_7e8;
  __normal_iterator<cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
  local_7e0;
  __normal_iterator<cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
  local_7d8;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *local_7d0;
  JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct> *local_7c8;
  allocator local_7b9;
  string local_7b8;
  ByteData local_798;
  allocator local_779;
  string local_778;
  ByteData local_758;
  allocator local_739;
  string local_738 [39];
  allocator local_711;
  string local_710 [39];
  allocator local_6e9;
  string local_6e8 [32];
  string local_6c8;
  ByteData local_6a8;
  string local_690;
  string local_670;
  ByteData local_650;
  string local_638;
  string local_618;
  XpubData *local_5f8;
  PsbtGlobalXpub local_5f0;
  ExtPubkey local_4e0;
  ExtPubkey *local_470;
  reference local_468;
  __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
  local_460;
  __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
  local_458;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *local_450;
  JsonObjectVector<cfd::api::json::PsbtGlobalXpub,_PsbtGlobalXpubStruct> *local_448;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_440;
  uint32_t local_424;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_420;
  allocator local_401;
  string local_400 [39];
  allocator local_3d9;
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [15];
  Transaction local_1b0;
  Psbt local_170;
  string local_f8 [32];
  NetType local_d8;
  undefined1 local_d2;
  allocator local_d1;
  string local_d0 [32];
  CfdSourceLocation local_b0;
  string local_98;
  string *local_78;
  undefined1 local_6a;
  allocator local_69;
  string local_68 [35];
  undefined1 local_45;
  allocator local_31;
  string local_30 [32];
  DecodePsbtInput *local_10;
  DecodePsbtRequest *local_8;
  
  error_code = (CfdError)((ulong)in_stack_ffffffffffffd918 >> 0x20);
  if (in_RDI == (DecodePsbtRequest *)0x0) {
    local_45 = 1;
    uVar7 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"request is null.",&local_31);
    core::CfdException::CfdException
              (in_stack_ffffffffffffd920,error_code,(string *)in_stack_ffffffffffffd910);
    local_45 = 0;
    __cxa_throw(uVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (in_RSI == (DecodePsbtInput *)0x0) {
    local_6a = 1;
    uVar7 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"response is null.",&local_69);
    core::CfdException::CfdException
              (in_stack_ffffffffffffd920,error_code,(string *)in_stack_ffffffffffffd910);
    local_6a = 0;
    __cxa_throw(uVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_10 = in_RSI;
  local_8 = in_RDI;
  DecodePsbtRequest::GetPsbt_abi_cxx11_((DecodePsbtRequest *)in_stack_ffffffffffffd8f8);
  local_78 = &local_98;
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) != 0) {
    local_b0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/jsonapi/cfd_json_psbt.cpp"
                 ,0x2f);
    local_b0.filename = local_b0.filename + 1;
    local_b0.line = 0x44;
    local_b0.funcname = "DecodePsbt";
    core::logger::warn<>(&local_b0,"Failed to DecodePsbt. empty psbt.");
    local_d2 = 1;
    uVar7 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"Invalid hex string. empty data.",&local_d1);
    core::CfdException::CfdException
              (in_stack_ffffffffffffd920,error_code,(string *)in_stack_ffffffffffffd910);
    local_d2 = 0;
    __cxa_throw(uVar7,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  DecodePsbtRequest::GetNetwork_abi_cxx11_((DecodePsbtRequest *)in_stack_ffffffffffffd8f8);
  NVar4 = TransactionJsonApi::ConvertNetType((string *)in_stack_ffffffffffffd960);
  std::__cxx11::string::~string(local_f8);
  local_d8 = NVar4;
  AddressFactory::AddressFactory
            ((AddressFactory *)in_stack_ffffffffffffd900,
             (NetType)((ulong)in_stack_ffffffffffffd8f8 >> 0x20));
  core::Psbt::Psbt(&local_170,local_78);
  core::Psbt::GetTransaction(&local_1b0,&local_170);
  DecodeRawTransactionRequest::DecodeRawTransactionRequest
            ((DecodeRawTransactionRequest *)in_stack_ffffffffffffd940);
  DecodeRawTransactionResponse::DecodeRawTransactionResponse
            ((DecodeRawTransactionResponse *)in_stack_ffffffffffffd950);
  PsbtMapData::PsbtMapData((PsbtMapData *)in_stack_ffffffffffffd940);
  core::AbstractTransaction::GetHex_abi_cxx11_(local_398,&local_1b0.super_AbstractTransaction);
  DecodeRawTransactionRequest::SetHex
            ((DecodeRawTransactionRequest *)in_stack_ffffffffffffd900,
             (string *)in_stack_ffffffffffffd8f8);
  DecodePsbtRequest::GetNetwork_abi_cxx11_((DecodePsbtRequest *)in_stack_ffffffffffffd8f8);
  DecodeRawTransactionRequest::SetNetwork
            ((DecodeRawTransactionRequest *)in_stack_ffffffffffffd900,
             (string *)in_stack_ffffffffffffd8f8);
  std::__cxx11::string::~string(local_3b8);
  TransactionJsonApi::DecodeRawTransaction(in_stack_ffffffffffffe5f0,in_stack_ffffffffffffe5e8);
  DecodePsbtResponse::SetTx
            ((DecodePsbtResponse *)in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
  bVar2 = DecodePsbtRequest::GetHasDetail(local_8);
  if (bVar2) {
    DecodePsbtResponse::SetTx_hex
              ((DecodePsbtResponse *)in_stack_ffffffffffffd900,(string *)in_stack_ffffffffffffd8f8);
    bVar2 = DecodePsbtRequest::GetHasSimple(local_8);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3d8,"tx",&local_3d9);
      DecodePsbtResponse::SetIgnoreItem
                ((DecodePsbtResponse *)in_stack_ffffffffffffd910,
                 (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
      std::__cxx11::string::~string(local_3d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_400,"tx_hex",&local_401);
    DecodePsbtResponse::SetIgnoreItem
              ((DecodePsbtResponse *)in_stack_ffffffffffffd910,
               (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
    std::__cxx11::string::~string(local_400);
    std::allocator<char>::~allocator((allocator<char> *)&local_401);
  }
  core::Psbt::GetGlobalRecordKeyList(&local_420,&local_170);
  bVar2 = DecodePsbtRequest::GetHasDetail(local_8);
  this = local_10;
  if (bVar2) {
    local_424 = core::Psbt::GetPsbtVersion(&local_170);
    DecodePsbtResponse::SetVersion((DecodePsbtResponse *)this,&local_424);
    core::Psbt::GetGlobalXpubkeyDataList(&local_440,&local_170);
    local_448 = DecodePsbtResponse::GetXpubs((DecodePsbtResponse *)local_10);
    local_450 = &local_440;
    local_458._M_current =
         (KeyData *)
         std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::begin(local_450);
    local_460._M_current =
         (KeyData *)
         std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::end(local_450);
    while (bVar2 = __gnu_cxx::operator!=(&local_458,&local_460), bVar2) {
      local_468 = __gnu_cxx::
                  __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
                  ::operator*(&local_458);
      core::KeyData::GetExtPubkey(&local_4e0,local_468);
      local_470 = &local_4e0;
      PsbtGlobalXpub::PsbtGlobalXpub(in_stack_ffffffffffffd950);
      local_5f8 = PsbtGlobalXpub::GetXpub(&local_5f0);
      core::ExtPubkey::ToString_abi_cxx11_(&local_618,local_470);
      XpubData::SetBase58((XpubData *)in_stack_ffffffffffffd900,(string *)in_stack_ffffffffffffd8f8)
      ;
      std::__cxx11::string::~string((string *)&local_618);
      core::ExtPubkey::GetData(&local_650,local_470);
      core::ByteData::GetHex_abi_cxx11_(&local_638,&local_650);
      XpubData::SetHex((XpubData *)in_stack_ffffffffffffd900,(string *)in_stack_ffffffffffffd8f8);
      std::__cxx11::string::~string((string *)&local_638);
      core::ByteData::~ByteData((ByteData *)0x699edc);
      core::KeyData::GetBip32Path_abi_cxx11_(&local_670,local_468,kApostrophe,false);
      PsbtGlobalXpub::SetPath
                ((PsbtGlobalXpub *)in_stack_ffffffffffffd900,(string *)in_stack_ffffffffffffd8f8);
      std::__cxx11::string::~string((string *)&local_670);
      core::KeyData::GetFingerprint(&local_6a8,local_468);
      core::ByteData::GetHex_abi_cxx11_(&local_690,&local_6a8);
      PsbtGlobalXpub::SetMaster_fingerprint
                ((PsbtGlobalXpub *)in_stack_ffffffffffffd900,(string *)in_stack_ffffffffffffd8f8);
      std::__cxx11::string::~string((string *)&local_690);
      core::ByteData::~ByteData((ByteData *)0x699f7a);
      core::KeyData::ToString_abi_cxx11_(&local_6c8,local_468,true,kApostrophe,false);
      PsbtGlobalXpub::SetDescriptorXpub
                ((PsbtGlobalXpub *)in_stack_ffffffffffffd900,(string *)in_stack_ffffffffffffd8f8);
      std::__cxx11::string::~string((string *)&local_6c8);
      std::vector<cfd::api::json::PsbtGlobalXpub,std::allocator<cfd::api::json::PsbtGlobalXpub>>::
      emplace_back<cfd::api::json::PsbtGlobalXpub&>
                ((vector<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>
                  *)in_stack_ffffffffffffd910,
                 (PsbtGlobalXpub *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
      PsbtGlobalXpub::~PsbtGlobalXpub((PsbtGlobalXpub *)in_stack_ffffffffffffd900);
      core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_ffffffffffffd900);
      __gnu_cxx::
      __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
      ::operator++(&local_458);
    }
    bVar2 = std::
            vector<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>
            ::empty((vector<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>
                     *)in_stack_ffffffffffffd910);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6e8,"xpubs",&local_6e9);
      DecodePsbtResponse::SetIgnoreItem
                ((DecodePsbtResponse *)in_stack_ffffffffffffd910,
                 (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
      std::__cxx11::string::~string(local_6e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
    }
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
               in_stack_ffffffffffffd910);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_710,"version",&local_711);
    DecodePsbtResponse::SetIgnoreItem
              ((DecodePsbtResponse *)in_stack_ffffffffffffd910,
               (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
    std::__cxx11::string::~string(local_710);
    std::allocator<char>::~allocator((allocator<char> *)&local_711);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_738,"xpubs",&local_739);
    DecodePsbtResponse::SetIgnoreItem
              ((DecodePsbtResponse *)in_stack_ffffffffffffd910,
               (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
    std::__cxx11::string::~string(local_738);
    std::allocator<char>::~allocator((allocator<char> *)&local_739);
    uVar5 = core::Psbt::GetPsbtVersion(&local_170);
    if (uVar5 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_778,"fb",&local_779);
      core::ByteData::ByteData(&local_758,&local_778);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
                (&local_420,&local_758);
      core::ByteData::~ByteData((ByteData *)0x69a3f9);
      std::__cxx11::string::~string((string *)&local_778);
      std::allocator<char>::~allocator((allocator<char> *)&local_779);
    }
  }
  uVar5 = core::Psbt::GetPsbtVersion(&local_170);
  if (uVar5 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_7b8,"fb",&local_7b9);
    core::ByteData::ByteData(&local_798,&local_7b8);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
              (&local_420,&local_798);
    core::ByteData::~ByteData((ByteData *)0x69a5ac);
    std::__cxx11::string::~string((string *)&local_7b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_7b9);
  }
  local_7c8 = DecodePsbtResponse::GetUnknown((DecodePsbtResponse *)local_10);
  local_7d0 = &local_420;
  local_7d8._M_current =
       (ByteData *)
       std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::begin(local_7d0);
  local_7e0._M_current =
       (ByteData *)
       std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::end(local_7d0);
  while (bVar2 = __gnu_cxx::operator!=(&local_7d8,&local_7e0), bVar2) {
    local_7e8 = __gnu_cxx::
                __normal_iterator<cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
                ::operator*(&local_7d8);
    bVar2 = DecodePsbtRequest::GetHasDetail(local_8);
    if ((!bVar2) || (uVar3 = core::ByteData::GetHeadData(local_7e8), uVar3 != '\x01')) {
      core::Psbt::GetGlobalRecord(&local_800,&local_170,local_7e8);
      core::ByteData::GetHex_abi_cxx11_(&local_820,local_7e8);
      PsbtMapData::SetKey((PsbtMapData *)in_stack_ffffffffffffd900,
                          (string *)in_stack_ffffffffffffd8f8);
      std::__cxx11::string::~string((string *)&local_820);
      core::ByteData::GetHex_abi_cxx11_(&local_840,&local_800);
      PsbtMapData::SetValue
                ((PsbtMapData *)in_stack_ffffffffffffd900,(string *)in_stack_ffffffffffffd8f8);
      std::__cxx11::string::~string((string *)&local_840);
      std::vector<cfd::api::json::PsbtMapData,std::allocator<cfd::api::json::PsbtMapData>>::
      emplace_back<cfd::api::json::PsbtMapData&>
                ((vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>
                  *)in_stack_ffffffffffffd910,
                 (PsbtMapData *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
      core::ByteData::~ByteData((ByteData *)0x69a7d2);
    }
    __gnu_cxx::
    __normal_iterator<cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
    ::operator++(&local_7d8);
  }
  bVar2 = DecodePsbtRequest::GetHasSimple(local_8);
  if ((bVar2) &&
     (bVar2 = std::vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>
              ::empty((vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>
                       *)in_stack_ffffffffffffd910), bVar2)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_860,"unknown",&local_861);
    DecodePsbtResponse::SetIgnoreItem
              ((DecodePsbtResponse *)in_stack_ffffffffffffd910,
               (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
    std::__cxx11::string::~string(local_860);
    std::allocator<char>::~allocator((allocator<char> *)&local_861);
  }
  core::Amount::Amount(&local_878);
  local_879 = 0;
  local_880 = core::Transaction::GetTxInCount(&local_1b0);
  local_884 = 0;
  do {
    if (local_880 <= local_884) {
      core::Amount::Amount(&local_1a98);
      local_880 = core::Transaction::GetTxOutCount(&local_1b0);
      for (local_1a9c = 0; uVar5 = core::Transaction::GetTxOutCount(&local_1b0), local_1a9c < uVar5;
          local_1a9c = local_1a9c + 1) {
        DecodePsbtOutput::DecodePsbtOutput(in_stack_ffffffffffffd930);
        core::Transaction::GetTxOut((TxOutReference *)&local_1ca0,&local_1b0,local_1a9c);
        local_1c50 = &local_1ca0;
        AVar11 = core::AbstractTxOutReference::GetValue(local_1c50);
        local_1cc0 = AVar11.amount_;
        local_1cb8 = AVar11.ignore_check_;
        local_1cb0.amount_ = local_1cc0;
        local_1cb0.ignore_check_ = (bool)local_1cb8;
        AVar11 = core::Amount::operator+=(&local_1a98,&local_1cb0);
        local_1cd0 = AVar11.amount_;
        local_1cc8 = AVar11.ignore_check_;
        local_1cd1 = false;
        core::Psbt::GetTxOutScript(&local_1d10,&local_170,local_1a9c,true,&local_1cd1);
        bVar2 = core::Script::IsEmpty(&local_1d10);
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1d30,"redeem_script",&local_1d31);
          DecodePsbtOutput::SetIgnoreItem
                    ((DecodePsbtOutput *)in_stack_ffffffffffffd910,
                     (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
          std::__cxx11::string::~string(local_1d30);
          std::allocator<char>::~allocator((allocator<char> *)&local_1d31);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1d58,"witness_script",&local_1d59);
          DecodePsbtOutput::SetIgnoreItem
                    ((DecodePsbtOutput *)in_stack_ffffffffffffd910,
                     (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
          std::__cxx11::string::~string(local_1d58);
          std::allocator<char>::~allocator((allocator<char> *)&local_1d59);
        }
        else if ((local_1cd1 & 1U) == 0) {
          paVar12 = &local_1e99;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1e98,"witness_script",paVar12);
          DecodePsbtOutput::SetIgnoreItem
                    ((DecodePsbtOutput *)in_stack_ffffffffffffd910,
                     (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
          std::__cxx11::string::~string(local_1e98);
          std::allocator<char>::~allocator((allocator<char> *)&local_1e99);
          DecodePsbtOutput::GetRedeem_script((DecodePsbtOutput *)&stack0xffffffffffffe3b8);
          core::Script::GetHex_abi_cxx11_(&local_1ec0,&local_1d10);
          PsbtScriptData::SetHex
                    ((PsbtScriptData *)in_stack_ffffffffffffd900,(string *)in_stack_ffffffffffffd8f8
                    );
          std::__cxx11::string::~string((string *)&local_1ec0);
          DecodePsbtOutput::GetRedeem_script((DecodePsbtOutput *)&stack0xffffffffffffe3b8);
          core::Script::ToString_abi_cxx11_(&local_1ee0,&local_1d10);
          PsbtScriptData::SetAsm
                    ((PsbtScriptData *)in_stack_ffffffffffffd900,(string *)in_stack_ffffffffffffd8f8
                    );
          std::__cxx11::string::~string((string *)&local_1ee0);
        }
        else {
          DecodePsbtOutput::GetWitness_script((DecodePsbtOutput *)&stack0xffffffffffffe3b8);
          core::Script::GetHex_abi_cxx11_(&local_1d80,&local_1d10);
          PsbtScriptData::SetHex
                    ((PsbtScriptData *)in_stack_ffffffffffffd900,(string *)in_stack_ffffffffffffd8f8
                    );
          std::__cxx11::string::~string((string *)&local_1d80);
          DecodePsbtOutput::GetWitness_script((DecodePsbtOutput *)&stack0xffffffffffffe3b8);
          core::Script::ToString_abi_cxx11_(&local_1da0,&local_1d10);
          PsbtScriptData::SetAsm
                    ((PsbtScriptData *)in_stack_ffffffffffffd900,(string *)in_stack_ffffffffffffd8f8
                    );
          std::__cxx11::string::~string((string *)&local_1da0);
          core::AbstractTxOutReference::GetLockingScript
                    ((AbstractTxOutReference *)in_stack_ffffffffffffd8f8);
          bVar2 = core::Script::IsP2shScript(&local_1dd8);
          core::Script::~Script((Script *)in_stack_ffffffffffffd900);
          if (bVar2) {
            core::ScriptUtil::CreateP2wshLockingScript(&local_1e10,&local_1d10);
            DecodePsbtOutput::GetRedeem_script((DecodePsbtOutput *)&stack0xffffffffffffe3b8);
            core::Script::GetHex_abi_cxx11_(&local_1e30,&local_1e10);
            PsbtScriptData::SetHex
                      ((PsbtScriptData *)in_stack_ffffffffffffd900,
                       (string *)in_stack_ffffffffffffd8f8);
            std::__cxx11::string::~string((string *)&local_1e30);
            DecodePsbtOutput::GetRedeem_script((DecodePsbtOutput *)&stack0xffffffffffffe3b8);
            core::Script::ToString_abi_cxx11_(&local_1e50,&local_1e10);
            PsbtScriptData::SetAsm
                      ((PsbtScriptData *)in_stack_ffffffffffffd900,
                       (string *)in_stack_ffffffffffffd8f8);
            std::__cxx11::string::~string((string *)&local_1e50);
            core::Script::~Script((Script *)in_stack_ffffffffffffd900);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1e70,"redeem_script",&local_1e71);
            DecodePsbtOutput::SetIgnoreItem
                      ((DecodePsbtOutput *)in_stack_ffffffffffffd910,
                       (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
            std::__cxx11::string::~string(local_1e70);
            std::allocator<char>::~allocator((allocator<char> *)&local_1e71);
          }
        }
        core::Psbt::GetTxOutKeyDataList(&local_1ef8,&local_170,local_1a9c);
        bVar2 = std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::empty
                          (&local_1ef8);
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1f18,"bip32_derivs",&local_1f19);
          DecodePsbtOutput::SetIgnoreItem
                    ((DecodePsbtOutput *)in_stack_ffffffffffffd910,
                     (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
          std::__cxx11::string::~string(local_1f18);
          std::allocator<char>::~allocator((allocator<char> *)&local_1f19);
        }
        else {
          this_01 = (PsbtBip32Data *)
                    DecodePsbtOutput::GetBip32_derivs((DecodePsbtOutput *)&stack0xffffffffffffe3b8);
          local_1f30 = &local_1ef8;
          local_1f28 = this_01;
          local_1f38._M_current =
               (KeyData *)
               std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::begin
                         (local_1f30);
          local_1f40._M_current =
               (KeyData *)
               std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::end(local_1f30)
          ;
          while (bVar2 = __gnu_cxx::operator!=(&local_1f38,&local_1f40), bVar2) {
            __gnu_cxx::
            __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
            ::operator*(&local_1f38);
            core::KeyData::KeyData(in_stack_ffffffffffffd940,in_stack_ffffffffffffd938);
            PsbtBip32Data::PsbtBip32Data(this_01);
            core::KeyData::GetPubkey(&local_2180,&local_2090);
            core::Pubkey::GetHex_abi_cxx11_(local_2168,&local_2180);
            PsbtBip32Data::SetPubkey
                      ((PsbtBip32Data *)in_stack_ffffffffffffd900,
                       (string *)in_stack_ffffffffffffd8f8);
            std::__cxx11::string::~string((string *)local_2168);
            core::Pubkey::~Pubkey((Pubkey *)0x69db28);
            core::KeyData::GetFingerprint(&local_21b8,&local_2090);
            core::ByteData::GetHex_abi_cxx11_(&local_21a0,&local_21b8);
            PsbtBip32Data::SetMaster_fingerprint
                      ((PsbtBip32Data *)in_stack_ffffffffffffd900,
                       (string *)in_stack_ffffffffffffd8f8);
            std::__cxx11::string::~string((string *)&local_21a0);
            core::ByteData::~ByteData((ByteData *)0x69db87);
            core::KeyData::GetBip32Path_abi_cxx11_(&local_21d8,&local_2090,kApostrophe,false);
            PsbtBip32Data::SetPath
                      ((PsbtBip32Data *)in_stack_ffffffffffffd900,
                       (string *)in_stack_ffffffffffffd8f8);
            std::__cxx11::string::~string((string *)&local_21d8);
            bVar2 = DecodePsbtRequest::GetHasDetail(local_8);
            if (bVar2) {
              core::KeyData::ToString_abi_cxx11_(&local_21f8,&local_2090,true,kApostrophe,false);
              PsbtBip32Data::SetDescriptor
                        ((PsbtBip32Data *)in_stack_ffffffffffffd900,
                         (string *)in_stack_ffffffffffffd8f8);
              std::__cxx11::string::~string((string *)&local_21f8);
            }
            else {
              paVar12 = &local_2219;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_2218,"descriptor",paVar12);
              PsbtBip32Data::SetIgnoreItem
                        ((PsbtBip32Data *)in_stack_ffffffffffffd910,
                         (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
              std::__cxx11::string::~string(local_2218);
              std::allocator<char>::~allocator((allocator<char> *)&local_2219);
            }
            std::vector<cfd::api::json::PsbtBip32Data,std::allocator<cfd::api::json::PsbtBip32Data>>
            ::emplace_back<cfd::api::json::PsbtBip32Data&>
                      ((vector<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>
                        *)in_stack_ffffffffffffd910,
                       (PsbtBip32Data *)
                       CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
            PsbtBip32Data::~PsbtBip32Data((PsbtBip32Data *)in_stack_ffffffffffffd900);
            core::KeyData::~KeyData((KeyData *)in_stack_ffffffffffffd900);
            __gnu_cxx::
            __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
            ::operator++(&local_1f38);
          }
        }
        core::Psbt::GetTxOutRecordKeyList(&local_2238,&local_170,local_1a9c);
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                   in_stack_ffffffffffffd910,
                   (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                   CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                   in_stack_ffffffffffffd910);
        local_2240 = &local_420;
        local_2248._M_current =
             (ByteData *)
             std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::begin
                       (local_2240);
        local_2250._M_current =
             (ByteData *)
             std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::end(local_2240)
        ;
        while (bVar2 = __gnu_cxx::operator!=(&local_2248,&local_2250), bVar2) {
          local_2258 = __gnu_cxx::
                       __normal_iterator<cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
                       ::operator*(&local_2248);
          core::Psbt::GetTxOutRecord(&local_2270,&local_170,local_1a9c,local_2258);
          core::ByteData::GetHex_abi_cxx11_(&local_2290,local_2258);
          PsbtMapData::SetKey((PsbtMapData *)in_stack_ffffffffffffd900,
                              (string *)in_stack_ffffffffffffd8f8);
          std::__cxx11::string::~string((string *)&local_2290);
          core::ByteData::GetHex_abi_cxx11_(&local_22b0,&local_2270);
          PsbtMapData::SetValue
                    ((PsbtMapData *)in_stack_ffffffffffffd900,(string *)in_stack_ffffffffffffd8f8);
          std::__cxx11::string::~string((string *)&local_22b0);
          DecodePsbtOutput::GetUnknown((DecodePsbtOutput *)&stack0xffffffffffffe3b8);
          std::vector<cfd::api::json::PsbtMapData,std::allocator<cfd::api::json::PsbtMapData>>::
          emplace_back<cfd::api::json::PsbtMapData&>
                    ((vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>
                      *)in_stack_ffffffffffffd910,
                     (PsbtMapData *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
          core::ByteData::~ByteData((ByteData *)0x69dfea);
          __gnu_cxx::
          __normal_iterator<cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
          ::operator++(&local_2248);
        }
        in_stack_ffffffffffffd940 =
             (KeyData *)DecodePsbtOutput::GetUnknown((DecodePsbtOutput *)&stack0xffffffffffffe3b8);
        bVar2 = std::
                vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>::
                empty((vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>
                       *)in_stack_ffffffffffffd910);
        if (bVar2) {
          in_stack_ffffffffffffd938 = (KeyData *)local_22d1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)(local_22d1 + 1),"unknown",(allocator *)in_stack_ffffffffffffd938);
          DecodePsbtOutput::SetIgnoreItem
                    ((DecodePsbtOutput *)in_stack_ffffffffffffd910,
                     (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
          std::__cxx11::string::~string((string *)(local_22d1 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_22d1);
        }
        in_stack_ffffffffffffd930 =
             (DecodePsbtOutput *)DecodePsbtResponse::GetOutputs((DecodePsbtResponse *)local_10);
        std::
        vector<cfd::api::json::DecodePsbtOutput,_std::allocator<cfd::api::json::DecodePsbtOutput>_>
        ::push_back((vector<cfd::api::json::DecodePsbtOutput,_std::allocator<cfd::api::json::DecodePsbtOutput>_>
                     *)in_stack_ffffffffffffd910,
                    (value_type *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
        std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
                  ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                   in_stack_ffffffffffffd910);
        core::Script::~Script((Script *)in_stack_ffffffffffffd900);
        core::TxOutReference::~TxOutReference((TxOutReference *)0x69e18c);
        DecodePsbtOutput::~DecodePsbtOutput((DecodePsbtOutput *)in_stack_ffffffffffffd900);
      }
      if (((local_879 & 1) != 0) || (bVar2 = core::operator>(&local_1a98,&local_878), bVar2)) {
        paVar12 = &local_22f9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_22f8,"fee",paVar12);
        DecodePsbtResponse::SetIgnoreItem
                  ((DecodePsbtResponse *)in_stack_ffffffffffffd910,
                   (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
        std::__cxx11::string::~string(local_22f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_22f9);
      }
      else {
        AVar11 = core::operator-(&local_878,&local_1a98);
        in_stack_ffffffffffffd910 = (DecodePsbtInput *)AVar11.amount_;
        local_2318.ignore_check_ = AVar11.ignore_check_;
        local_2318.amount_ = (int64_t)in_stack_ffffffffffffd910;
        local_2308 = core::Amount::GetSatoshiValue(&local_2318);
        DecodePsbtResponse::SetFee((DecodePsbtResponse *)local_10,&local_2308);
        in_stack_ffffffffffffd900 = local_10;
      }
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 in_stack_ffffffffffffd910);
      std::__cxx11::string::~string((string *)local_398);
      PsbtMapData::~PsbtMapData((PsbtMapData *)in_stack_ffffffffffffd900);
      DecodeRawTransactionResponse::~DecodeRawTransactionResponse
                ((DecodeRawTransactionResponse *)in_stack_ffffffffffffd900);
      DecodeRawTransactionRequest::~DecodeRawTransactionRequest
                ((DecodeRawTransactionRequest *)in_stack_ffffffffffffd900);
      core::Transaction::~Transaction((Transaction *)in_stack_ffffffffffffd900);
      core::Psbt::~Psbt((Psbt *)in_stack_ffffffffffffd900);
      AddressFactory::~AddressFactory((AddressFactory *)0x69e3d0);
      std::__cxx11::string::~string((string *)&local_98);
      return;
    }
    DecodePsbtInput::DecodePsbtInput(in_stack_ffffffffffffd980);
    core::Transaction::GetTxIn((TxInReference *)&local_d80,&local_1b0,local_884);
    local_d81 = 0;
    local_d82 = false;
    core::Psbt::GetTxInUtxo((TxOut *)&local_dd8,&local_170,local_884,true,&local_d82);
    core::AbstractTxOut::GetLockingScript(&local_e10,&local_dd8);
    bVar2 = core::Script::IsEmpty(&local_e10);
    local_2426 = 1;
    if (!bVar2) {
      local_2426 = local_d82 ^ 0xff;
    }
    core::Script::~Script((Script *)in_stack_ffffffffffffd900);
    if ((local_2426 & 1) == 0) {
      local_d81 = 1;
      AVar11 = core::AbstractTxOut::GetValue(&local_dd8);
      local_e58 = AVar11.amount_;
      local_e50 = AVar11.ignore_check_;
      local_e48.amount_ = local_e58;
      local_e48.ignore_check_ = (bool)local_e50;
      AVar11 = core::Amount::operator+=(&local_878,&local_e48);
      local_e68 = AVar11.amount_;
      local_e60 = AVar11.ignore_check_;
      pDVar9 = DecodePsbtInput::GetWitness_utxo(&local_cf0);
      AVar11 = core::AbstractTxOut::GetValue(&local_dd8);
      local_e90 = AVar11.amount_;
      local_e88 = AVar11.ignore_check_;
      local_e80.amount_ = local_e90;
      local_e80.ignore_check_ = (bool)local_e88;
      local_e70 = core::Amount::GetSatoshiValue(&local_e80);
      DecodePsbtUtxo::SetAmount(pDVar9,&local_e70);
      pDVar9 = DecodePsbtInput::GetWitness_utxo(&local_cf0);
      local_e98 = DecodePsbtUtxo::GetScriptPubKey(pDVar9);
      std::__cxx11::string::string(local_eb8);
      core::AbstractTxOut::GetLockingScript(&local_f08,&local_dd8);
      TransactionJsonApi::ConvertFromLockingScript
                ((AddressFactory *)in_stack_ffffffffffffe548,in_stack_ffffffffffffe540,
                 (string *)in_stack_ffffffffffffe538,(int64_t *)in_stack_ffffffffffffe530);
      core::Script::~Script((Script *)in_stack_ffffffffffffd900);
      bVar2 = std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::empty
                        ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                         in_stack_ffffffffffffd910);
      if (!bVar2) {
        this_00 = std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::operator[]
                            (&local_ed0,0);
        core::Address::GetAddress_abi_cxx11_(&local_f28,this_00);
        DecodePsbtLockingScript::SetAddress
                  ((DecodePsbtLockingScript *)in_stack_ffffffffffffd900,
                   (string *)in_stack_ffffffffffffd8f8);
        std::__cxx11::string::~string((string *)&local_f28);
      }
      core::AbstractTxOut::GetLockingScript(&local_f80,&local_dd8);
      core::Script::GetHex_abi_cxx11_(&local_f48,&local_f80);
      DecodePsbtLockingScript::SetHex
                ((DecodePsbtLockingScript *)in_stack_ffffffffffffd900,
                 (string *)in_stack_ffffffffffffd8f8);
      std::__cxx11::string::~string((string *)&local_f48);
      core::Script::~Script((Script *)in_stack_ffffffffffffd900);
      core::AbstractTxOut::GetLockingScript(&local_fd8,&local_dd8);
      core::Script::ToString_abi_cxx11_(&local_fa0,&local_fd8);
      DecodePsbtLockingScript::SetAsm
                ((DecodePsbtLockingScript *)in_stack_ffffffffffffd900,
                 (string *)in_stack_ffffffffffffd8f8);
      std::__cxx11::string::~string((string *)&local_fa0);
      core::Script::~Script((Script *)in_stack_ffffffffffffd900);
      DecodePsbtLockingScript::SetType
                ((DecodePsbtLockingScript *)in_stack_ffffffffffffd900,
                 (string *)in_stack_ffffffffffffd8f8);
      std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::~vector
                ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                 in_stack_ffffffffffffd910);
      std::__cxx11::string::~string(local_eb8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e30,"witness_utxo",&local_e31);
      DecodePsbtInput::SetIgnoreItem
                (in_stack_ffffffffffffd910,
                 (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
      std::__cxx11::string::~string(local_e30);
      std::allocator<char>::~allocator((allocator<char> *)&local_e31);
    }
    core::Psbt::GetTxInUtxoFull(&local_1018,&local_170,local_884,true,(bool *)0x0);
    core::AbstractTransaction::GetTxid(&local_1038,&local_1018.super_AbstractTransaction);
    core::AbstractTxInReference::GetTxid((AbstractTxInReference *)in_stack_ffffffffffffd8f8);
    bVar2 = core::Txid::Equals(&local_1038,&local_1058);
    core::Txid::~Txid((Txid *)0x69b0dd);
    core::Txid::~Txid((Txid *)0x69b0ea);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      core::AbstractTransaction::GetHex_abi_cxx11_
                (&local_10c8,&local_1018.super_AbstractTransaction);
      DecodeRawTransactionRequest::SetHex
                ((DecodeRawTransactionRequest *)in_stack_ffffffffffffd900,
                 (string *)in_stack_ffffffffffffd8f8);
      DecodePsbtRequest::GetNetwork_abi_cxx11_((DecodePsbtRequest *)in_stack_ffffffffffffd8f8);
      DecodeRawTransactionRequest::SetNetwork
                ((DecodeRawTransactionRequest *)in_stack_ffffffffffffd900,
                 (string *)in_stack_ffffffffffffd8f8);
      std::__cxx11::string::~string(local_10e8);
      TransactionJsonApi::DecodeRawTransaction(in_stack_ffffffffffffe5f0,in_stack_ffffffffffffe5e8);
      DecodePsbtInput::SetNon_witness_utxo(in_stack_ffffffffffffd900,in_stack_ffffffffffffd8f8);
      bVar2 = DecodePsbtRequest::GetHasDetail(local_8);
      if (bVar2) {
        DecodePsbtInput::SetNon_witness_utxo_hex
                  (in_stack_ffffffffffffd900,(string *)in_stack_ffffffffffffd8f8);
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1108,"non_witness_utxo_hex",&local_1109);
          DecodePsbtInput::SetIgnoreItem
                    (in_stack_ffffffffffffd910,
                     (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
          std::__cxx11::string::~string(local_1108);
          std::allocator<char>::~allocator((allocator<char> *)&local_1109);
        }
        bVar2 = DecodePsbtRequest::GetHasSimple(local_8);
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1130,"non_witness_utxo",&local_1131);
          DecodePsbtInput::SetIgnoreItem
                    (in_stack_ffffffffffffd910,
                     (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
          std::__cxx11::string::~string(local_1130);
          std::allocator<char>::~allocator((allocator<char> *)&local_1131);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1158,"non_witness_utxo_hex",&local_1159);
        DecodePsbtInput::SetIgnoreItem
                  (in_stack_ffffffffffffd910,
                   (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
        std::__cxx11::string::~string(local_1158);
        std::allocator<char>::~allocator((allocator<char> *)&local_1159);
      }
      if ((local_d81 & 1) == 0) {
        uVar5 = core::Transaction::GetTxOutCount(&local_1018);
        uVar6 = core::AbstractTxInReference::GetVout(&local_d80);
        if (uVar6 < uVar5) {
          uVar5 = core::AbstractTxInReference::GetVout(&local_d80);
          core::Transaction::GetTxOut((TxOutReference *)&local_11b0,&local_1018,uVar5);
          AVar11 = core::AbstractTxOutReference::GetValue(&local_11b0);
          local_11d0 = AVar11.amount_;
          local_11c8 = AVar11.ignore_check_;
          local_11c0.amount_ = local_11d0;
          local_11c0.ignore_check_ = (bool)local_11c8;
          AVar11 = core::Amount::operator+=(&local_878,&local_11c0);
          local_11e0 = AVar11.amount_;
          local_11d8 = AVar11.ignore_check_;
          local_d81 = 1;
          core::TxOutReference::~TxOutReference((TxOutReference *)0x69b772);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1200,"non_witness_utxo",&local_1201);
          DecodePsbtInput::SetIgnoreItem
                    (in_stack_ffffffffffffd910,
                     (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
          std::__cxx11::string::~string(local_1200);
          std::allocator<char>::~allocator((allocator<char> *)&local_1201);
          local_879 = 1;
        }
      }
      std::__cxx11::string::~string((string *)&local_10c8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1078,"non_witness_utxo",&local_1079);
      DecodePsbtInput::SetIgnoreItem
                (in_stack_ffffffffffffd910,
                 (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
      std::__cxx11::string::~string(local_1078);
      std::allocator<char>::~allocator((allocator<char> *)&local_1079);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_10a0,"non_witness_utxo_hex",&local_10a1);
      DecodePsbtInput::SetIgnoreItem
                (in_stack_ffffffffffffd910,
                 (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
      std::__cxx11::string::~string(local_10a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_10a1);
      if ((local_d81 & 1) == 0) {
        local_879 = 1;
      }
    }
    core::Psbt::GetTxInSignaturePubkeyList(&local_1220,&local_170,local_884);
    bVar2 = std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::empty(&local_1220);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1240,"partial_signatures",&local_1241);
      DecodePsbtInput::SetIgnoreItem
                (in_stack_ffffffffffffd910,
                 (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
      std::__cxx11::string::~string(local_1240);
      std::allocator<char>::~allocator((allocator<char> *)&local_1241);
    }
    else {
      local_1250 = DecodePsbtInput::GetPartial_signatures(&local_cf0);
      local_1258 = &local_1220;
      local_1260._M_current =
           (Pubkey *)
           std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::begin
                     ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                      in_stack_ffffffffffffd8f8);
      local_1268._M_current =
           (Pubkey *)
           std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::end
                     ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
                      in_stack_ffffffffffffd8f8);
      while (bVar2 = __gnu_cxx::operator!=(&local_1260,&local_1268), bVar2) {
        __gnu_cxx::
        __normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
        ::operator*(&local_1260);
        core::Pubkey::Pubkey
                  ((Pubkey *)in_stack_ffffffffffffd900,(Pubkey *)in_stack_ffffffffffffd8f8);
        core::Psbt::GetTxInSignature(&local_1298,&local_170,local_884,&local_1280);
        PsbtSignatureData::PsbtSignatureData((PsbtSignatureData *)in_stack_ffffffffffffd940);
        core::Pubkey::GetHex_abi_cxx11_(local_1330,&local_1280);
        PsbtSignatureData::SetPubkey
                  ((PsbtSignatureData *)in_stack_ffffffffffffd900,
                   (string *)in_stack_ffffffffffffd8f8);
        std::__cxx11::string::~string((string *)local_1330);
        core::ByteData::GetHex_abi_cxx11_(&local_1350,&local_1298);
        PsbtSignatureData::SetSignature
                  ((PsbtSignatureData *)in_stack_ffffffffffffd900,
                   (string *)in_stack_ffffffffffffd8f8);
        std::__cxx11::string::~string((string *)&local_1350);
        std::
        vector<cfd::api::json::PsbtSignatureData,std::allocator<cfd::api::json::PsbtSignatureData>>
        ::emplace_back<cfd::api::json::PsbtSignatureData&>
                  ((vector<cfd::api::json::PsbtSignatureData,_std::allocator<cfd::api::json::PsbtSignatureData>_>
                    *)in_stack_ffffffffffffd910,
                   (PsbtSignatureData *)
                   CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
        PsbtSignatureData::~PsbtSignatureData((PsbtSignatureData *)in_stack_ffffffffffffd900);
        core::ByteData::~ByteData((ByteData *)0x69bad8);
        core::Pubkey::~Pubkey((Pubkey *)0x69bae5);
        __gnu_cxx::
        __normal_iterator<cfd::core::Pubkey_*,_std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>_>
        ::operator++(&local_1260);
      }
    }
    bVar2 = core::Psbt::IsFindTxInSighashType(&local_170,local_884);
    if (bVar2) {
      core::Psbt::GetTxInSighashType((Psbt *)local_1380,(uint32_t)&local_170);
      core::SigHashType::ToString_abi_cxx11_(local_13a0);
      DecodePsbtInput::SetSighash(in_stack_ffffffffffffd900,(string *)in_stack_ffffffffffffd8f8);
      std::__cxx11::string::~string((string *)local_13a0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1370,"sighash",(allocator *)(local_1380 + 0xf));
      DecodePsbtInput::SetIgnoreItem
                (in_stack_ffffffffffffd910,
                 (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
      std::__cxx11::string::~string(local_1370);
      std::allocator<char>::~allocator((allocator<char> *)(local_1380 + 0xf));
    }
    core::Psbt::GetTxInRedeemScriptDirect(&local_13d8,&local_170,local_884,true,false);
    bVar2 = core::Script::IsEmpty(&local_13d8);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_13f8,"redeem_script",&local_13f9);
      DecodePsbtInput::SetIgnoreItem
                (in_stack_ffffffffffffd910,
                 (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
      std::__cxx11::string::~string(local_13f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_13f9);
    }
    else {
      std::__cxx11::string::string(local_1420);
      TransactionJsonApi::ConvertFromLockingScript
                ((AddressFactory *)in_stack_ffffffffffffe548,in_stack_ffffffffffffe540,
                 (string *)in_stack_ffffffffffffe538,(int64_t *)in_stack_ffffffffffffe530);
      DecodePsbtInput::GetRedeem_script(&local_cf0);
      core::Script::GetHex_abi_cxx11_(&local_1458,&local_13d8);
      PsbtScriptData::SetHex
                ((PsbtScriptData *)in_stack_ffffffffffffd900,(string *)in_stack_ffffffffffffd8f8);
      std::__cxx11::string::~string((string *)&local_1458);
      DecodePsbtInput::GetRedeem_script(&local_cf0);
      core::Script::ToString_abi_cxx11_(&local_1478,&local_13d8);
      PsbtScriptData::SetAsm
                ((PsbtScriptData *)in_stack_ffffffffffffd900,(string *)in_stack_ffffffffffffd8f8);
      std::__cxx11::string::~string((string *)&local_1478);
      DecodePsbtInput::GetRedeem_script(&local_cf0);
      PsbtScriptData::SetType
                ((PsbtScriptData *)in_stack_ffffffffffffd900,(string *)in_stack_ffffffffffffd8f8);
      std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::~vector
                ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                 in_stack_ffffffffffffd910);
      std::__cxx11::string::~string(local_1420);
    }
    core::Psbt::GetTxInRedeemScriptDirect(&local_14b0,&local_170,local_884,true,true);
    bVar2 = core::Script::IsEmpty(&local_14b0);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_14d0,"witness_script",&local_14d1);
      DecodePsbtInput::SetIgnoreItem
                (in_stack_ffffffffffffd910,
                 (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
      std::__cxx11::string::~string(local_14d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_14d1);
    }
    else {
      std::__cxx11::string::string(local_14f8);
      TransactionJsonApi::ConvertFromLockingScript
                ((AddressFactory *)in_stack_ffffffffffffe548,in_stack_ffffffffffffe540,
                 (string *)in_stack_ffffffffffffe538,(int64_t *)in_stack_ffffffffffffe530);
      DecodePsbtInput::GetWitness_script(&local_cf0);
      core::Script::GetHex_abi_cxx11_(&local_1530,&local_14b0);
      PsbtScriptData::SetHex
                ((PsbtScriptData *)in_stack_ffffffffffffd900,(string *)in_stack_ffffffffffffd8f8);
      std::__cxx11::string::~string((string *)&local_1530);
      DecodePsbtInput::GetWitness_script(&local_cf0);
      core::Script::ToString_abi_cxx11_(&local_1550,&local_14b0);
      PsbtScriptData::SetAsm
                ((PsbtScriptData *)in_stack_ffffffffffffd900,(string *)in_stack_ffffffffffffd8f8);
      std::__cxx11::string::~string((string *)&local_1550);
      DecodePsbtInput::GetWitness_script(&local_cf0);
      PsbtScriptData::SetType
                ((PsbtScriptData *)in_stack_ffffffffffffd900,(string *)in_stack_ffffffffffffd8f8);
      std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::~vector
                ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                 in_stack_ffffffffffffd910);
      std::__cxx11::string::~string(local_14f8);
    }
    core::Psbt::GetTxInKeyDataList(&local_1568,&local_170,local_884);
    bVar2 = std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::empty(&local_1568)
    ;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1588,"bip32_derivs",&local_1589);
      DecodePsbtInput::SetIgnoreItem
                (in_stack_ffffffffffffd910,
                 (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
      std::__cxx11::string::~string(local_1588);
      std::allocator<char>::~allocator((allocator<char> *)&local_1589);
    }
    else {
      local_1598 = DecodePsbtInput::GetBip32_derivs(&local_cf0);
      local_15a0 = &local_1568;
      local_15a8._M_current =
           (KeyData *)
           std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::begin(local_15a0);
      local_15b0._M_current =
           (KeyData *)
           std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::end(local_15a0);
      while (bVar2 = __gnu_cxx::operator!=(&local_15a8,&local_15b0), bVar2) {
        __gnu_cxx::
        __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
        ::operator*(&local_15a8);
        core::KeyData::KeyData(in_stack_ffffffffffffd940,in_stack_ffffffffffffd938);
        PsbtBip32Data::PsbtBip32Data(in_stack_ffffffffffffd960);
        core::KeyData::GetPubkey(&local_17f0,&local_1700);
        core::Pubkey::GetHex_abi_cxx11_(local_17d8,&local_17f0);
        PsbtBip32Data::SetPubkey
                  ((PsbtBip32Data *)in_stack_ffffffffffffd900,(string *)in_stack_ffffffffffffd8f8);
        std::__cxx11::string::~string((string *)local_17d8);
        core::Pubkey::~Pubkey((Pubkey *)0x69c4cb);
        core::KeyData::GetFingerprint(&local_1828,&local_1700);
        core::ByteData::GetHex_abi_cxx11_(&local_1810,&local_1828);
        PsbtBip32Data::SetMaster_fingerprint
                  ((PsbtBip32Data *)in_stack_ffffffffffffd900,(string *)in_stack_ffffffffffffd8f8);
        std::__cxx11::string::~string((string *)&local_1810);
        core::ByteData::~ByteData((ByteData *)0x69c52a);
        core::KeyData::GetBip32Path_abi_cxx11_(&local_1848,&local_1700,kApostrophe,false);
        PsbtBip32Data::SetPath
                  ((PsbtBip32Data *)in_stack_ffffffffffffd900,(string *)in_stack_ffffffffffffd8f8);
        std::__cxx11::string::~string((string *)&local_1848);
        bVar2 = DecodePsbtRequest::GetHasDetail(local_8);
        if (bVar2) {
          core::KeyData::ToString_abi_cxx11_(&local_1868,&local_1700,true,kApostrophe,false);
          PsbtBip32Data::SetDescriptor
                    ((PsbtBip32Data *)in_stack_ffffffffffffd900,(string *)in_stack_ffffffffffffd8f8)
          ;
          std::__cxx11::string::~string((string *)&local_1868);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1888,"descriptor",&local_1889);
          PsbtBip32Data::SetIgnoreItem
                    ((PsbtBip32Data *)in_stack_ffffffffffffd910,
                     (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
          std::__cxx11::string::~string(local_1888);
          std::allocator<char>::~allocator((allocator<char> *)&local_1889);
        }
        std::vector<cfd::api::json::PsbtBip32Data,std::allocator<cfd::api::json::PsbtBip32Data>>::
        emplace_back<cfd::api::json::PsbtBip32Data&>
                  ((vector<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>
                    *)in_stack_ffffffffffffd910,
                   (PsbtBip32Data *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
        PsbtBip32Data::~PsbtBip32Data((PsbtBip32Data *)in_stack_ffffffffffffd900);
        core::KeyData::~KeyData((KeyData *)in_stack_ffffffffffffd900);
        __gnu_cxx::
        __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
        ::operator++(&local_15a8);
      }
    }
    core::Psbt::GetTxInFinalScript(&local_18a8,&local_170,local_884,false);
    bVar2 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::empty
                      (&local_18a8);
    if (bVar2) {
LAB_0069c9ec:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1940,"final_scriptsig",&local_1941);
      DecodePsbtInput::SetIgnoreItem
                (in_stack_ffffffffffffd910,
                 (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
      std::__cxx11::string::~string(local_1940);
      std::allocator<char>::~allocator((allocator<char> *)&local_1941);
    }
    else {
      pvVar10 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                          (&local_18a8,0);
      bVar2 = core::ByteData::IsEmpty(pvVar10);
      if (bVar2) goto LAB_0069c9ec;
      DecodePsbtInput::GetFinal_scriptsig(&local_cf0);
      pvVar10 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                          (&local_18a8,0);
      core::ByteData::GetHex_abi_cxx11_(&local_18c8,pvVar10);
      DecodeUnlockingScript::SetHex
                ((DecodeUnlockingScript *)in_stack_ffffffffffffd900,
                 (string *)in_stack_ffffffffffffd8f8);
      std::__cxx11::string::~string((string *)&local_18c8);
      DecodePsbtInput::GetFinal_scriptsig(&local_cf0);
      pvVar10 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                          (&local_18a8,0);
      core::Script::Script(&local_1920,pvVar10);
      core::Script::ToString_abi_cxx11_(&local_18e8,&local_1920);
      DecodeUnlockingScript::SetAsm
                ((DecodeUnlockingScript *)in_stack_ffffffffffffd900,
                 (string *)in_stack_ffffffffffffd8f8);
      std::__cxx11::string::~string((string *)&local_18e8);
      core::Script::~Script((Script *)in_stack_ffffffffffffd900);
    }
    core::Psbt::GetTxInFinalScript(&local_1960,&local_170,local_884,true);
    bVar2 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::empty
                      (&local_1960);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1980,"final_scriptwitness",&local_1981);
      DecodePsbtInput::SetIgnoreItem
                (in_stack_ffffffffffffd910,
                 (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
      std::__cxx11::string::~string(local_1980);
      std::allocator<char>::~allocator((allocator<char> *)&local_1981);
    }
    else {
      local_1990 = DecodePsbtInput::GetFinal_scriptwitness_abi_cxx11_(&local_cf0);
      local_1998 = &local_1960;
      local_19a0._M_current =
           (ByteData *)
           std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::begin(local_1998)
      ;
      local_19a8._M_current =
           (ByteData *)
           std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::end(local_1998);
      while (bVar2 = __gnu_cxx::operator!=(&local_19a0,&local_19a8), bVar2) {
        local_19b0 = __gnu_cxx::
                     __normal_iterator<cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
                     ::operator*(&local_19a0);
        pJVar1 = &local_1990->
                  super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ;
        core::ByteData::GetHex_abi_cxx11_(&local_19d0,local_19b0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &pJVar1->
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ,&local_19d0);
        std::__cxx11::string::~string((string *)&local_19d0);
        __gnu_cxx::
        __normal_iterator<cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
        ::operator++(&local_19a0);
      }
    }
    core::Psbt::GetTxInRecordKeyList(&local_19e8,&local_170,local_884);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               in_stack_ffffffffffffd910,
               (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               in_stack_ffffffffffffd910);
    local_19f0 = &local_420;
    local_19f8._M_current =
         (ByteData *)
         std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::begin(local_19f0);
    local_1a00._M_current =
         (ByteData *)
         std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::end(local_19f0);
    while (bVar2 = __gnu_cxx::operator!=(&local_19f8,&local_1a00), bVar2) {
      key_00 = __gnu_cxx::
               __normal_iterator<cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
               ::operator*(&local_19f8);
      core::Psbt::GetTxInRecord((ByteData *)&stack0xffffffffffffe5e0,&local_170,local_884,key_00);
      core::ByteData::GetHex_abi_cxx11_(&local_1a40,key_00);
      PsbtMapData::SetKey((PsbtMapData *)in_stack_ffffffffffffd900,
                          (string *)in_stack_ffffffffffffd8f8);
      std::__cxx11::string::~string((string *)&local_1a40);
      core::ByteData::GetHex_abi_cxx11_(&local_1a60,(ByteData *)&stack0xffffffffffffe5e0);
      PsbtMapData::SetValue
                ((PsbtMapData *)in_stack_ffffffffffffd900,(string *)in_stack_ffffffffffffd8f8);
      std::__cxx11::string::~string((string *)&local_1a60);
      DecodePsbtInput::GetUnknown(&local_cf0);
      std::vector<cfd::api::json::PsbtMapData,std::allocator<cfd::api::json::PsbtMapData>>::
      emplace_back<cfd::api::json::PsbtMapData&>
                ((vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>
                  *)in_stack_ffffffffffffd910,
                 (PsbtMapData *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
      core::ByteData::~ByteData((ByteData *)0x69ce44);
      __gnu_cxx::
      __normal_iterator<cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
      ::operator++(&local_19f8);
    }
    DecodePsbtInput::GetUnknown(&local_cf0);
    bVar2 = std::vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>::
            empty((vector<cfd::api::json::PsbtMapData,_std::allocator<cfd::api::json::PsbtMapData>_>
                   *)in_stack_ffffffffffffd910);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1a80,"unknown",&local_1a81);
      DecodePsbtInput::SetIgnoreItem
                (in_stack_ffffffffffffd910,
                 (string *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
      std::__cxx11::string::~string(local_1a80);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a81);
    }
    DecodePsbtResponse::GetInputs((DecodePsbtResponse *)local_10);
    std::vector<cfd::api::json::DecodePsbtInput,_std::allocator<cfd::api::json::DecodePsbtInput>_>::
    push_back((vector<cfd::api::json::DecodePsbtInput,_std::allocator<cfd::api::json::DecodePsbtInput>_>
               *)in_stack_ffffffffffffd910,
              (value_type *)CONCAT17(in_stack_ffffffffffffd90f,in_stack_ffffffffffffd908));
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               in_stack_ffffffffffffd910);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               in_stack_ffffffffffffd910);
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
               in_stack_ffffffffffffd910);
    core::Script::~Script((Script *)in_stack_ffffffffffffd900);
    core::Script::~Script((Script *)in_stack_ffffffffffffd900);
    std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
              ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)
               in_stack_ffffffffffffd910);
    core::Transaction::~Transaction((Transaction *)in_stack_ffffffffffffd900);
    core::TxOut::~TxOut((TxOut *)0x69d03c);
    core::TxInReference::~TxInReference((TxInReference *)0x69d049);
    DecodePsbtInput::~DecodePsbtInput(in_stack_ffffffffffffd900);
    local_884 = local_884 + 1;
  } while( true );
}

Assistant:

void PsbtJsonApi::DecodePsbt(
    DecodePsbtRequest* request, DecodePsbtResponse* response) {
  if (request == nullptr) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "request is null.");
  }
  if (response == nullptr) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "response is null.");
  }
  // validate input hex
  const std::string& hex_string = request->GetPsbt();
  if (hex_string.empty()) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to DecodePsbt. empty psbt.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid hex string. empty data.");
  }

  auto net_type = TransactionJsonApi::ConvertNetType(request->GetNetwork());
  AddressFactory addr_factory(net_type);

  // Decode transaction hex
  Psbt psbt(hex_string);
  Transaction tx = psbt.GetTransaction();

  DecodeRawTransactionRequest tx_req;
  DecodeRawTransactionResponse tx_res;
  PsbtMapData item;

  // global
  auto tx_hex = tx.GetHex();
  tx_req.SetHex(tx_hex);
  tx_req.SetNetwork(request->GetNetwork());
  TransactionJsonApi::DecodeRawTransaction(&tx_req, &tx_res);
  response->SetTx(tx_res);
  if (request->GetHasDetail()) {
    response->SetTx_hex(tx_hex);
    if (request->GetHasSimple()) response->SetIgnoreItem("tx");
  } else {
    response->SetIgnoreItem("tx_hex");
  }

  auto key_list = psbt.GetGlobalRecordKeyList();
    if (request->GetHasDetail()) {
      response->SetVersion(psbt.GetPsbtVersion());
      auto xpub_list = psbt.GetGlobalXpubkeyDataList();
      auto& xpubs = response->GetXpubs();
      for (const auto& xpub : xpub_list) {
        const auto& extkey = xpub.GetExtPubkey();
        PsbtGlobalXpub xpub_obj;
        auto& xpub_data = xpub_obj.GetXpub();
        xpub_data.SetBase58(extkey.ToString());
        xpub_data.SetHex(extkey.GetData().GetHex());
        xpub_obj.SetPath(xpub.GetBip32Path());
        xpub_obj.SetMaster_fingerprint(xpub.GetFingerprint().GetHex());
        xpub_obj.SetDescriptorXpub(xpub.ToString());
        xpubs.emplace_back(xpub_obj);
      }
      if (xpubs.empty()) response->SetIgnoreItem("xpubs");
    } else {
      response->SetIgnoreItem("version");
      response->SetIgnoreItem("xpubs");
      if (psbt.GetPsbtVersion() > 0) key_list.push_back(ByteData("fb"));
    }

  if (psbt.GetPsbtVersion() > 0) {
    key_list.push_back(ByteData("fb"));
  }
  auto& unknown_list = response->GetUnknown();
  for (const auto& key : key_list) {
      if (request->GetHasDetail() && (key.GetHeadData() == Psbt::kPsbtGlobalXpub)) {
        continue;
      }
    auto data = psbt.GetGlobalRecord(key);
    item.SetKey(key.GetHex());
    item.SetValue(data.GetHex());
    unknown_list.emplace_back(item);
  }
  if (request->GetHasSimple() && unknown_list.empty()) {
    response->SetIgnoreItem("unknown");
  }

  Amount total_input;
  bool is_unset_utxo = false;
  uint32_t max = static_cast<uint32_t>(tx.GetTxInCount());
  for (uint32_t index=0; index<max; ++index) {
    DecodePsbtInput input;
    auto tx_input = tx.GetTxIn(index);
    bool has_amount = false;
      bool is_witness = false;

    auto utxo = psbt.GetTxInUtxo(index, true, &is_witness);
    if (utxo.GetLockingScript().IsEmpty() || (!is_witness)) {
      input.SetIgnoreItem("witness_utxo");
    } else {
      has_amount = true;
      total_input += utxo.GetValue();
      input.GetWitness_utxo().SetAmount(utxo.GetValue().GetSatoshiValue());
      auto& script = input.GetWitness_utxo().GetScriptPubKey();

      std::string script_type;
      auto addr_list = TransactionJsonApi::ConvertFromLockingScript(
          addr_factory, utxo.GetLockingScript(), &script_type, nullptr);
      if (!addr_list.empty()) {
        script.SetAddress(addr_list[0].GetAddress());
      }
      script.SetHex(utxo.GetLockingScript().GetHex());
      script.SetAsm(utxo.GetLockingScript().ToString());
      script.SetType(script_type);
    }

    auto full_utxo = psbt.GetTxInUtxoFull(index, true);
    if (!full_utxo.GetTxid().Equals(tx_input.GetTxid())) {
      input.SetIgnoreItem("non_witness_utxo");
      input.SetIgnoreItem("non_witness_utxo_hex");
      if (!has_amount) is_unset_utxo = true;
    } else {
      auto utxo_tx_hex = full_utxo.GetHex();
      tx_req.SetHex(utxo_tx_hex);
      tx_req.SetNetwork(request->GetNetwork());
      TransactionJsonApi::DecodeRawTransaction(&tx_req, &tx_res);
      input.SetNon_witness_utxo(tx_res);

      if (request->GetHasDetail()) {
        input.SetNon_witness_utxo_hex(utxo_tx_hex);
        if (utxo_tx_hex.empty()) {
          input.SetIgnoreItem("non_witness_utxo_hex");
        }
        if (request->GetHasSimple()) {
          input.SetIgnoreItem("non_witness_utxo");
        }
      } else {
        input.SetIgnoreItem("non_witness_utxo_hex");
      }
      if (has_amount) {
        // do nothing
      } else if (full_utxo.GetTxOutCount() > tx_input.GetVout()) {
        auto txout = full_utxo.GetTxOut(tx_input.GetVout());
        total_input += txout.GetValue();
        has_amount = true;
      } else {
        input.SetIgnoreItem("non_witness_utxo");
        is_unset_utxo = true;
      }
    }

    auto sig_pubkey_list = psbt.GetTxInSignaturePubkeyList(index);
    if (sig_pubkey_list.empty()) {
      input.SetIgnoreItem("partial_signatures");
    } else {
      auto& sig_list = input.GetPartial_signatures();
      for (auto pubkey : sig_pubkey_list) {
        auto sig = psbt.GetTxInSignature(index, pubkey);
        PsbtSignatureData sig_data;
        sig_data.SetPubkey(pubkey.GetHex());
        sig_data.SetSignature(sig.GetHex());
        sig_list.emplace_back(sig_data);
      }
    }

    if (!psbt.IsFindTxInSighashType(index)) {
      input.SetIgnoreItem("sighash");
    } else {
      auto sighashtype = psbt.GetTxInSighashType(index);
      input.SetSighash(sighashtype.ToString());
    }

    Script redeem_script = psbt.GetTxInRedeemScriptDirect(index, true, false);
    if (redeem_script.IsEmpty()) {
      input.SetIgnoreItem("redeem_script");
    } else {
      std::string script_type;
      auto addr_list = TransactionJsonApi::ConvertFromLockingScript(
          addr_factory, redeem_script, &script_type, nullptr);
      input.GetRedeem_script().SetHex(redeem_script.GetHex());
      input.GetRedeem_script().SetAsm(redeem_script.ToString());
      input.GetRedeem_script().SetType(script_type);
    }

    Script witness_script = psbt.GetTxInRedeemScriptDirect(index, true, true);
    if (witness_script.IsEmpty()) {
      input.SetIgnoreItem("witness_script");
    } else {
      std::string script_type;
      auto addr_list = TransactionJsonApi::ConvertFromLockingScript(
          addr_factory, witness_script, &script_type, nullptr);
      input.GetWitness_script().SetHex(witness_script.GetHex());
      input.GetWitness_script().SetAsm(witness_script.ToString());
      input.GetWitness_script().SetType(script_type);
    }

    auto bip32_pubkey_list = psbt.GetTxInKeyDataList(index);
    if (bip32_pubkey_list.empty()) {
      input.SetIgnoreItem("bip32_derivs");
    } else {
      auto& bip32_list = input.GetBip32_derivs();
      for (auto key_data : bip32_pubkey_list) {
        PsbtBip32Data bip32_data;
        bip32_data.SetPubkey(key_data.GetPubkey().GetHex());
        bip32_data.SetMaster_fingerprint(key_data.GetFingerprint().GetHex());
        bip32_data.SetPath(key_data.GetBip32Path());
        
          if (request->GetHasDetail()) {
            bip32_data.SetDescriptor(key_data.ToString());
          } else {
            bip32_data.SetIgnoreItem("descriptor");
          }
        bip32_list.emplace_back(bip32_data);
      }
    }

    auto scriptsig_arr = psbt.GetTxInFinalScript(index, false);
    if ((!scriptsig_arr.empty()) && (!scriptsig_arr[0].IsEmpty())) {
      input.GetFinal_scriptsig().SetHex(scriptsig_arr[0].GetHex());
      input.GetFinal_scriptsig().SetAsm(Script(scriptsig_arr[0]).ToString());
    } else {
      input.SetIgnoreItem("final_scriptsig");
    }

    auto witness_stack = psbt.GetTxInFinalScript(index, true);
    if (witness_stack.empty()) {
      input.SetIgnoreItem("final_scriptwitness");
    } else {
      auto& witness = input.GetFinal_scriptwitness();
      for (const auto& stack : witness_stack) {
        witness.emplace_back(stack.GetHex());
      }
    }

    key_list = psbt.GetTxInRecordKeyList(index);
    for (const auto& key : key_list) {
      auto data = psbt.GetTxInRecord(index, key);
      item.SetKey(key.GetHex());
      item.SetValue(data.GetHex());
      input.GetUnknown().emplace_back(item);
    }
    if (input.GetUnknown().empty()) input.SetIgnoreItem("unknown");

    response->GetInputs().push_back(input);
  }

  Amount total_output;
  max = static_cast<uint32_t>(tx.GetTxOutCount());
  for (uint32_t index=0; index<tx.GetTxOutCount(); ++index) {
    DecodePsbtOutput output;
    const auto& txout = tx.GetTxOut(index);
    total_output += txout.GetValue();
    bool is_witness = false;
    auto script = psbt.GetTxOutScript(index, true, &is_witness);
    if (script.IsEmpty()) {
      output.SetIgnoreItem("redeem_script");
      output.SetIgnoreItem("witness_script");
    } else if (is_witness) {
      output.GetWitness_script().SetHex(script.GetHex());
      output.GetWitness_script().SetAsm(script.ToString());
      if (txout.GetLockingScript().IsP2shScript()) {
        auto sh_script = ScriptUtil::CreateP2wshLockingScript(script);
        output.GetRedeem_script().SetHex(sh_script.GetHex());
        output.GetRedeem_script().SetAsm(sh_script.ToString());
      } else {
        output.SetIgnoreItem("redeem_script");
      }
    } else {
      output.SetIgnoreItem("witness_script");
      output.GetRedeem_script().SetHex(script.GetHex());
      output.GetRedeem_script().SetAsm(script.ToString());
    }

    auto bip32_pubkey_list = psbt.GetTxOutKeyDataList(index);
    if (bip32_pubkey_list.empty()) {
      output.SetIgnoreItem("bip32_derivs");
    } else {
      auto& bip32_list = output.GetBip32_derivs();
      for (auto key_data : bip32_pubkey_list) {
        PsbtBip32Data bip32_data;
        bip32_data.SetPubkey(key_data.GetPubkey().GetHex());
        bip32_data.SetMaster_fingerprint(key_data.GetFingerprint().GetHex());
        bip32_data.SetPath(key_data.GetBip32Path());
        
          if (request->GetHasDetail()) {
            bip32_data.SetDescriptor(key_data.ToString());
          } else {
            bip32_data.SetIgnoreItem("descriptor");
          }
        bip32_list.emplace_back(bip32_data);
      }
    }

    key_list = psbt.GetTxOutRecordKeyList(index);
    for (const auto& key : key_list) {
      auto data = psbt.GetTxOutRecord(index, key);
      item.SetKey(key.GetHex());
      item.SetValue(data.GetHex());
      output.GetUnknown().emplace_back(item);
    }
    if (output.GetUnknown().empty()) output.SetIgnoreItem("unknown");

    response->GetOutputs().push_back(output);
  }

  if (is_unset_utxo || (total_output > total_input)) {
    response->SetIgnoreItem("fee");
  } else {
    response->SetFee((total_input - total_output).GetSatoshiValue());
  }
}